

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O1

ON_Mesh * __thiscall ON_Mesh::MeshPart(ON_Mesh *this,ON_MeshPart *mesh_part,ON_Mesh *mesh)

{
  int *piVar1;
  byte bVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  ON_MeshPart *pOVar9;
  bool bVar10;
  int vertex_count;
  ON_Mesh *pOVar11;
  long lVar12;
  bool bVar13;
  char *sFormat;
  uint uVar14;
  bool bVar15;
  int iVar16;
  int iVar17;
  long lVar18;
  bool bHasVertexNormals;
  bool bHasTextureCoordinates;
  long lVar19;
  long lVar20;
  long lVar21;
  bool bHidden;
  ON_MeshFace local_a8;
  ON_SimpleArray<ON_MeshFace> *local_90;
  ON_Mesh *local_88;
  long local_80;
  ON_MeshPart *local_78;
  ON_Mesh *local_70;
  ON_SimpleArray<bool> *local_68;
  ON_SimpleArray<ON_SurfaceCurvature> *local_60;
  ON_SimpleArray<ON_2dPoint> *local_58;
  ON_SimpleArray<ON_Color> *local_50;
  ON_SimpleArray<ON_2fPoint> *local_48;
  ON_SimpleArray<ON_3fVector> *local_40;
  ON_SimpleArray<ON_3fPoint> *local_38;
  
  if (this == mesh) {
    sFormat = "ON_Mesh::MeshPart this == mesh";
    iVar17 = 0x2dbf;
  }
  else {
    if (mesh != (ON_Mesh *)0x0) {
      Destroy(mesh);
    }
    iVar17 = mesh_part->fi[0];
    if (-1 < iVar17) {
      iVar16 = mesh_part->fi[1];
      if ((iVar17 <= iVar16) && (iVar16 <= (this->m_F).m_count)) {
        iVar3 = mesh_part->vi[0];
        if (-1 < iVar3) {
          iVar4 = mesh_part->vi[1];
          uVar14 = iVar4 - iVar3;
          if ((uVar14 != 0 && iVar3 <= iVar4) &&
             (iVar4 <= (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count)) {
            iVar3 = (this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_count;
            iVar4 = (this->m_F).m_count;
            bVar10 = 0 < iVar3;
            bHasVertexNormals =
                 (this->m_N).super_ON_SimpleArray<ON_3fVector>.m_count == iVar3 && bVar10;
            bHasTextureCoordinates =
                 (this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_count == iVar3 && bVar10;
            iVar5 = (this->m_C).m_count;
            local_80 = CONCAT71(local_80._1_7_,
                                (this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_count == iVar4);
            iVar6 = (this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_count;
            iVar7 = (this->m_K).m_count;
            local_90 = (ON_SimpleArray<ON_MeshFace> *)
                       CONCAT71(local_90._1_7_,(this->m_H).m_count == iVar3);
            iVar8 = this->m_hidden_count;
            pOVar11 = mesh;
            local_78 = mesh_part;
            if (mesh == (ON_Mesh *)0x0) {
              pOVar11 = (ON_Mesh *)operator_new(0x6e0);
              ON_Mesh(pOVar11,local_78->triangle_count,local_78->vertex_count,bHasVertexNormals,
                      bHasTextureCoordinates);
            }
            bVar15 = iVar5 == iVar3 && bVar10;
            bVar13 = iVar6 == iVar3 && bVar10;
            if ((bVar15) && ((uint)(pOVar11->m_C).m_capacity < uVar14)) {
              ON_SimpleArray<ON_Color>::SetCapacity(&pOVar11->m_C,(long)(int)uVar14);
            }
            bVar10 = bVar10 && iVar7 == iVar3;
            if ((bVar13) &&
               ((uint)(pOVar11->m_S).super_ON_SimpleArray<ON_2dPoint>.m_capacity < uVar14)) {
              ON_SimpleArray<ON_2dPoint>::SetCapacity
                        (&(pOVar11->m_S).super_ON_SimpleArray<ON_2dPoint>,(long)(int)uVar14);
            }
            local_90 = (ON_SimpleArray<ON_MeshFace> *)
                       CONCAT71(local_90._1_7_,(byte)local_90 & 0 < iVar8);
            if ((bVar10) && ((uint)(pOVar11->m_K).m_capacity < uVar14)) {
              ON_SimpleArray<ON_SurfaceCurvature>::SetCapacity(&pOVar11->m_K,(long)(int)uVar14);
            }
            bVar2 = 0 < iVar4 & (byte)local_80;
            if (((byte)local_90 != '\0') && ((uint)(pOVar11->m_H).m_capacity < uVar14)) {
              ON_SimpleArray<bool>::SetCapacity(&pOVar11->m_H,(long)(int)uVar14);
            }
            pOVar9 = local_78;
            local_70 = mesh;
            if ((bVar2 != 0) &&
               ((uint)(pOVar11->m_FN).super_ON_SimpleArray<ON_3fVector>.m_capacity <
                (uint)(iVar16 - iVar17))) {
              ON_SimpleArray<ON_3fVector>::SetCapacity
                        (&(pOVar11->m_FN).super_ON_SimpleArray<ON_3fVector>,(long)(iVar16 - iVar17))
              ;
            }
            iVar17 = pOVar9->vi[0];
            lVar12 = (long)iVar17;
            iVar16 = pOVar9->vi[1];
            local_88 = pOVar11;
            local_80 = lVar12;
            if (iVar17 < iVar16) {
              local_38 = &(pOVar11->m_V).super_ON_SimpleArray<ON_3fPoint>;
              local_40 = &(pOVar11->m_N).super_ON_SimpleArray<ON_3fVector>;
              local_48 = &(pOVar11->m_T).super_ON_SimpleArray<ON_2fPoint>;
              local_50 = &pOVar11->m_C;
              local_58 = &(pOVar11->m_S).super_ON_SimpleArray<ON_2dPoint>;
              local_60 = &pOVar11->m_K;
              local_68 = &pOVar11->m_H;
              lVar21 = lVar12 * 4;
              lVar20 = lVar12 * 0xc;
              lVar19 = lVar12 * 8;
              lVar18 = lVar12 << 4;
              iVar16 = iVar16 - iVar17;
              do {
                ON_SimpleArray<ON_3fPoint>::Append
                          (local_38,(ON_3fPoint *)
                                    ((long)&((this->m_V).super_ON_SimpleArray<ON_3fPoint>.m_a)->x +
                                    lVar20));
                if (bHasVertexNormals) {
                  ON_SimpleArray<ON_3fVector>::Append
                            (local_40,(ON_3fVector *)
                                      ((long)&((this->m_N).super_ON_SimpleArray<ON_3fVector>.m_a)->x
                                      + lVar20));
                }
                if (bHasTextureCoordinates) {
                  ON_SimpleArray<ON_2fPoint>::Append
                            (local_48,(ON_2fPoint *)
                                      ((long)&((this->m_T).super_ON_SimpleArray<ON_2fPoint>.m_a)->x
                                      + lVar19));
                }
                if (bVar15) {
                  ON_SimpleArray<ON_Color>::Append
                            (local_50,(ON_Color *)((long)&((this->m_C).m_a)->field_0 + lVar21));
                }
                if (bVar13) {
                  ON_SimpleArray<ON_2dPoint>::Append
                            (local_58,(ON_2dPoint *)
                                      ((long)&((this->m_S).super_ON_SimpleArray<ON_2dPoint>.m_a)->x
                                      + lVar18));
                }
                if (bVar10) {
                  ON_SimpleArray<ON_SurfaceCurvature>::Append
                            (local_60,(ON_SurfaceCurvature *)((long)&((this->m_K).m_a)->k1 + lVar18)
                            );
                }
                if ((byte)local_90 != '\0') {
                  local_a8.vi[0] = CONCAT31(local_a8.vi[0]._1_3_,(this->m_H).m_a[lVar12]);
                  ON_SimpleArray<bool>::Append(local_68,(bool *)&local_a8);
                  if ((char)local_a8.vi[0] == '\x01') {
                    local_88->m_hidden_count = local_88->m_hidden_count + 1;
                  }
                }
                lVar12 = lVar12 + 1;
                lVar20 = lVar20 + 0xc;
                lVar19 = lVar19 + 8;
                lVar21 = lVar21 + 4;
                lVar18 = lVar18 + 0x10;
                iVar16 = iVar16 + -1;
              } while (iVar16 != 0);
            }
            pOVar11 = local_88;
            if (local_88->m_hidden_count < 1) {
              ON_SimpleArray<bool>::SetCapacity(&local_88->m_H,0);
              pOVar11->m_hidden_count = 0;
            }
            iVar17 = local_78->fi[0];
            bVar10 = false;
            if (iVar17 < local_78->fi[1]) {
              local_90 = &pOVar11->m_F;
              lVar21 = (long)iVar17 << 4;
              lVar12 = (long)iVar17 * 0xc;
              iVar17 = local_78->fi[1] - iVar17;
              iVar16 = 0;
              do {
                piVar1 = (int *)((long)((this->m_F).m_a)->vi + lVar21);
                local_a8.vi[0] = (int)local_80;
                local_a8.vi[1] = piVar1[1] - local_a8.vi[0];
                local_a8.vi[2] = piVar1[2] - local_a8.vi[0];
                local_a8.vi[3] = piVar1[3] - local_a8.vi[0];
                local_a8.vi[0] = *piVar1 - local_a8.vi[0];
                if ((((local_a8.vi[0] < (int)uVar14 && -1 < local_a8.vi[0]) &&
                     (-1 < local_a8.vi[1] && local_a8.vi[1] < (int)uVar14)) &&
                    (-1 < local_a8.vi[2] && local_a8.vi[2] < (int)uVar14)) &&
                   (local_a8.vi[3] < (int)uVar14 && -1 < local_a8.vi[3])) {
                  ON_SimpleArray<ON_MeshFace>::Append(local_90,&local_a8);
                  if (bVar2 != 0) {
                    ON_SimpleArray<ON_3fVector>::Append
                              (&(pOVar11->m_FN).super_ON_SimpleArray<ON_3fVector>,
                               (ON_3fVector *)
                               ((long)&((this->m_FN).super_ON_SimpleArray<ON_3fVector>.m_a)->x +
                               lVar12));
                  }
                }
                else {
                  iVar16 = iVar16 + 1;
                  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
                             ,0x2e26,"","ON_Mesh::MeshPart Invalid face in partition");
                }
                lVar21 = lVar21 + 0x10;
                lVar12 = lVar12 + 0xc;
                iVar17 = iVar17 + -1;
              } while (iVar17 != 0);
              bVar10 = 0 < iVar16;
              pOVar11 = local_88;
            }
            if (!(bool)((pOVar11->m_F).m_count < 1 & bVar10)) {
              return pOVar11;
            }
            if (pOVar11 == local_70) {
              Destroy(local_70);
            }
            else {
              (*(pOVar11->super_ON_Geometry).super_ON_Object._vptr_ON_Object[4])(pOVar11);
            }
            return (ON_Mesh *)0x0;
          }
        }
        sFormat = "ON_Mesh::MeshPart mesh_part.vi[] is not valid";
        iVar17 = 0x2dd4;
        goto LAB_00515916;
      }
    }
    sFormat = "ON_Mesh::MeshPart mesh_part.fi[] is not valid";
    iVar17 = 0x2dcb;
  }
LAB_00515916:
  ON_ErrorEx("/workspace/llm4binary/github/license_c_cmakelists/mcneel[P]opennurbs/opennurbs_mesh.cpp"
             ,iVar17,"",sFormat);
  return (ON_Mesh *)0x0;
}

Assistant:

ON_Mesh* ON_Mesh::MeshPart( 
  const ON_MeshPart& mesh_part,
  ON_Mesh* mesh 
  ) const
{
  if ( this == mesh )
  {
    ON_ERROR("ON_Mesh::MeshPart this == mesh");
    return 0;
  }

  if ( mesh )
    mesh->Destroy();

  if (    mesh_part.fi[0] < 0 
       || mesh_part.fi[1] > m_F.Count()
       || mesh_part.fi[0] > mesh_part.fi[1]
       )
  {
    ON_ERROR("ON_Mesh::MeshPart mesh_part.fi[] is not valid");
    return 0;
  }

  if (    mesh_part.vi[0] < 0
       || mesh_part.vi[1] > m_V.Count()
       || mesh_part.vi[0] >= mesh_part.vi[1]
       )
  {
    ON_ERROR("ON_Mesh::MeshPart mesh_part.vi[] is not valid");
    return 0;
  }

  const int submesh_V_count = mesh_part.vi[1] - mesh_part.vi[0];
  const int submesh_F_count = mesh_part.fi[1] - mesh_part.fi[0];

  const bool bHasVertexNormals = HasVertexNormals();
  const bool bHasTextureCoordinates = HasTextureCoordinates();
  const bool bHasVertexColors = HasVertexColors();
  const bool bHasFaceNormals = HasFaceNormals();
  const bool bHasSurfaceParameters = HasSurfaceParameters();
  const bool bHasPrincipalCurvatures = HasPrincipalCurvatures();
  const bool bHasHiddenVertices = HiddenVertexCount() > 0;

  ON_Mesh* submesh = (0 != mesh)
                   ? mesh
                   : new ON_Mesh(mesh_part.triangle_count,
                                 mesh_part.vertex_count,
                                 bHasVertexNormals,
                                 bHasTextureCoordinates
                                 );

  if ( bHasVertexColors )
    submesh->m_C.Reserve(submesh_V_count);
  if ( bHasSurfaceParameters )
    submesh->m_S.Reserve(submesh_V_count);
  if ( bHasPrincipalCurvatures )
    submesh->m_K.Reserve(submesh_V_count);
  if ( bHasHiddenVertices )
    submesh->m_H.Reserve(submesh_V_count);
  if ( bHasFaceNormals )
    submesh->m_FN.Reserve(submesh_F_count);

  // put vertex information into submesh
  const int vi0 = mesh_part.vi[0];
  const int vi1 = mesh_part.vi[1];
  for ( int vi = vi0; vi < vi1; vi++ )
  {
    submesh->m_V.Append(m_V[vi]);
    if ( bHasVertexNormals )
      submesh->m_N.Append(m_N[vi]);
    if ( bHasTextureCoordinates )
      submesh->m_T.Append(m_T[vi]);
    if ( bHasVertexColors )
      submesh->m_C.Append(m_C[vi]);
    if ( bHasSurfaceParameters )
      submesh->m_S.Append(m_S[vi]);
    if ( bHasPrincipalCurvatures )
      submesh->m_K.Append(m_K[vi]);
    if ( bHasHiddenVertices )
    {
      bool bHidden = m_H[vi];
      submesh->m_H.Append(bHidden);
      if ( bHidden )
        submesh->m_hidden_count++;
    }
  }
  if ( submesh->m_hidden_count <= 0 )
  {
    submesh->m_H.Destroy();
    submesh->m_hidden_count = 0;
  }

  // put face information into submesh
  int bad_face_count = 0;
  const int fi0 = mesh_part.fi[0];
  const int fi1 = mesh_part.fi[1];
  for ( int fi = fi0; fi < fi1; fi++ )
  {
    ON_MeshFace f = m_F[fi];
    f.vi[0] -= vi0;
    f.vi[1] -= vi0;
    f.vi[2] -= vi0;
    f.vi[3] -= vi0;
    if (    f.vi[0] >= submesh_V_count || f.vi[0] < 0 
         || f.vi[1] >= submesh_V_count || f.vi[1] < 0 
         || f.vi[2] >= submesh_V_count || f.vi[2] < 0 
         || f.vi[3] >= submesh_V_count || f.vi[3] < 0 
         )
    {
      bad_face_count++;
      ON_ERROR("ON_Mesh::MeshPart Invalid face in partition");
      continue;
    }
    submesh->m_F.Append(f);
    if ( bHasFaceNormals )
      submesh->m_FN.Append(m_FN[fi]);
  }

  if ( submesh->m_F.Count() < 1 && bad_face_count > 0 )
  {
    if ( submesh != mesh )
      delete submesh;
    else
      mesh->Destroy();

    submesh = 0;
  }

  return submesh;
}